

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

bool ON_XMLNodePrivate::GetNextTag(ON_wString *tag,wchar_t **pBuffer,bool bValidateTag)

{
  bool bVar1;
  wchar_t *wsz;
  wchar_t *pwVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  wchar_t wVar5;
  int numChars;
  
  wsz = *pBuffer;
  while( true ) {
    if (*wsz == L'\0') {
      return false;
    }
    if (*wsz == L'<') break;
    wsz = wsz + 1;
  }
  wVar5 = wsz[1];
  if (wVar5 == L'?') {
    wVar3 = L'<';
    do {
      while (wVar3 != L'?') {
        if (wVar3 == L'\0') {
          return false;
        }
        wVar3 = wsz[1];
LAB_00682fbd:
        wsz = wsz + 1;
      }
      wVar3 = wsz[1];
      if (wVar3 != L'>') goto LAB_00682fbd;
      wsz = wsz + -1;
      do {
        pwVar4 = wsz;
        wsz = pwVar4 + 1;
      } while (pwVar4[1] != L'<');
      wVar5 = pwVar4[2];
      wVar3 = L'<';
    } while (wVar5 == L'?');
  }
joined_r0x00682fc6:
  if (((wVar5 != L'!') || (wsz[2] != L'-')) || (wsz[3] != L'-')) {
    wVar5 = L'<';
    numChars = 1;
    pwVar4 = wsz;
    while( true ) {
      pwVar4 = pwVar4 + 1;
      if (wVar5 == L'\0') {
        return false;
      }
      if (wVar5 == L'>') break;
      wVar5 = *pwVar4;
      numChars = numChars + 1;
    }
    *pBuffer = pwVar4;
    if (numChars < 2) {
      return false;
    }
    ON_wString::Set(tag,wsz,numChars);
    if (!bValidateTag) {
      return true;
    }
    bVar1 = AssertValidTag(tag);
    if (!bVar1) {
      AttemptToFixTag(tag);
      AssertValidTag(tag);
      return true;
    }
    return true;
  }
  pwVar4 = wsz + -1;
  wVar5 = L'<';
  do {
    if (wVar5 == L'-') {
      wVar5 = wsz[1];
      if ((wVar5 == L'-') && (wVar5 = L'-', wsz[2] == L'>')) break;
    }
    else {
      if (wVar5 == L'\0') {
        return false;
      }
      wVar5 = wsz[1];
    }
    wsz = wsz + 1;
    pwVar4 = pwVar4 + 1;
  } while( true );
  do {
    pwVar2 = pwVar4;
    wsz = pwVar2 + 1;
    pwVar4 = wsz;
  } while (pwVar2[1] != L'<');
  wVar5 = pwVar2[2];
  goto joined_r0x00682fc6;
}

Assistant:

bool ON_XMLNodePrivate::GetNextTag(ON_wString& tag, wchar_t*& pBuffer, bool bValidateTag) // Static.
{
  auto* start = pBuffer;
  while (*start != L'<')
  {
    if (0 == *start)
    {
      OUTPUT_DEBUG_STRING_EOL(L"Start of tag '<' not found");
      return false;
    }

    start++;
  }

  while (start[1] == L'?')
  {
    // This is a nasty document description tag - need to look for the end tag and skip it.
    while (!(start[0] == L'?' && start[1] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of document description tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  while ((start[1] == L'!') && (start[2] == L'-') && (start[3] == L'-'))
  {
    // This is a comment tag - need to look for the end tag and skip it.
    while (!(start[0] == L'-' && start[1] == L'-' && start[2] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of comment tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  wchar_t* pEnd = start;
  while (*pEnd != L'>')
  {
    if (0 == *pEnd)
    {
      OUTPUT_DEBUG_STRING_EOL(L"End of tag '>' not found");
      return false;
    }

    pEnd++;
  }

  pBuffer = pEnd + 1;

  // Copy the tag into the ready-made string.
  const auto numChars = int(pEnd - start + 1);
  if (numChars < 2)
    return false;

  tag.Set(start, numChars);

  if (bValidateTag)
  {
    if (!AssertValidTag(tag))
    {
      AttemptToFixTag(tag);
      AssertValidTag(tag);
    }
  }

  return true;
}